

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationshipRecord.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::RelationshipRecord::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,RelationshipRecord *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KStringStream ss;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Relationship Record:",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tNature:   ",0xc);
  ENUMS::GetEnumAsStringRelationshipNature_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)this->m_ui16Nature,Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tPosition: ",0xc);
  ENUMS::GetEnumAsStringRelationshipPosition_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)this->m_ui16Pos,Value_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString RelationshipRecord::GetAsString() const
{
    KStringStream ss;

    ss << "Relationship Record:"
       << "\n\tNature:   " << GetEnumAsStringRelationshipNature( m_ui16Nature )
       << "\n\tPosition: " << GetEnumAsStringRelationshipPosition( m_ui16Pos )
       << "\n";

    return ss.str();
}